

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O0

void __thiscall
MemoryFile_FileIsInitiallyEmpty_Test::TestBody(MemoryFile_FileIsInitiallyEmpty_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  AssertHelper local_e0;
  Message local_d8;
  uint64_t local_d0;
  uint local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8 [3];
  uint64_t local_90;
  uint local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  shared_ptr<void> local_60;
  undefined1 local_50 [8];
  in_memory mf;
  size_t elements;
  MemoryFile_FileIsInitiallyEmpty_Test *this_local;
  
  mf.pos_ = 0xd;
  this_00 = &gtest_ar.message_;
  anon_unknown.dwarf_16883::MemoryFile::make_buffer((MemoryFile *)this_00,0xd);
  std::shared_ptr<void>::shared_ptr<unsigned_char,void>
            (&local_60,(shared_ptr<unsigned_char> *)this_00);
  pstore::file::in_memory::in_memory((in_memory *)local_50,&local_60,0xd,0,true);
  std::shared_ptr<void>::~shared_ptr(&local_60);
  std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)this_00);
  local_84 = 0;
  local_90 = pstore::file::in_memory::tell((in_memory *)local_50);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_80,"0U","mf.tell ()",&local_84,&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(local_a8);
    pMVar2 = testing::Message::operator<<
                       (local_a8,(char (*) [41])"Expected the initial file offset to be 0");
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x1b3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_c4 = 0;
  local_d0 = pstore::file::in_memory::size((in_memory *)local_50);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_c0,"0U","mf.size ()",&local_c4,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pMVar2 = testing::Message::operator<<
                       (&local_d8,(char (*) [40])"Expected the file to be initially empty");
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x1b4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  pstore::file::in_memory::~in_memory((in_memory *)local_50);
  return;
}

Assistant:

TEST_F (MemoryFile, FileIsInitiallyEmpty) {
    constexpr std::size_t elements = 13;
    pstore::file::in_memory mf (MemoryFile::make_buffer (elements), elements);
    EXPECT_EQ (0U, mf.tell ()) << "Expected the initial file offset to be 0";
    EXPECT_EQ (0U, mf.size ()) << "Expected the file to be initially empty";
}